

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_alloc.c
# Opt level: O2

void * ngx_memalign(size_t alignment,size_t size,ngx_log_t *log)

{
  int err;
  ulong uVar1;
  void *local_28;
  void *p;
  
  err = posix_memalign(&local_28,alignment,size);
  uVar1 = log->log_level;
  if (err != 0) {
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else {
      ngx_log_error_core(1,log,err,"posix_memalign(%uz, %uz) failed",alignment,size);
      uVar1 = log->log_level;
    }
    local_28 = (void *)0x0;
  }
  if ((uVar1 & 0x20) != 0) {
    ngx_log_error_core(8,log,0,"posix_memalign: %p:%uz @%uz",local_28,size,alignment);
  }
  return local_28;
}

Assistant:

void *
ngx_memalign(size_t alignment, size_t size, ngx_log_t *log)
{
    void  *p;
    int    err;

    err = posix_memalign(&p, alignment, size);

    if (err) {
        ngx_log_error(NGX_LOG_EMERG, log, err,
                      "posix_memalign(%uz, %uz) failed", alignment, size);
        p = NULL;
    }

    ngx_log_debug3(NGX_LOG_DEBUG_ALLOC, log, 0,
                   "posix_memalign: %p:%uz @%uz", p, size, alignment);

    return p;
}